

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O1

void Eigen::internal::queryCacheSizes(int *l1,int *l2,int *l3)

{
  uint *puVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  
  piVar9 = (int *)cpuid_basic_info(0);
  iVar3 = *piVar9;
  iVar5 = piVar9[1];
  iVar7 = piVar9[2];
  iVar8 = piVar9[3];
  if (iVar8 == 0x6c65746e && (iVar7 == 0x49656e69 && iVar5 == 0x756e6547)) {
    if (3 < iVar3) {
      *l3 = 0;
      *l2 = 0;
      *l1 = 0;
      uVar10 = 0;
      while( true ) {
        puVar1 = (uint *)cpuid_Deterministic_Cache_Parameters_info(4);
        uVar4 = *puVar1;
        uVar6 = puVar1[1];
        if (((uVar4 & 0xd) == 1) &&
           (((uVar11 = uVar4 >> 5 & 7, piVar9 = l1, uVar11 == 1 || (piVar9 = l3, uVar11 == 3)) ||
            (piVar9 = l2, uVar11 == 2)))) {
          *piVar9 = (puVar1[3] + 1) * ((uVar6 >> 0x16) + 1) *
                    ((uVar6 & 0xfff) + 1) * ((uVar6 >> 0xc & 0x3ff) + 1);
        }
        if ((uVar4 & 0xf) == 0) break;
        bVar12 = 0xe < uVar10;
        uVar10 = uVar10 + 1;
        if (bVar12) {
          return;
        }
      }
      return;
    }
  }
  else {
    if ((iVar8 == 0x444d4163 && (iVar7 == 0x69746e65 && iVar5 == 0x68747541)) ||
       (iVar8 == 0x21726574 && (iVar7 == 0x74656273 && iVar5 == 0x69444d41))) {
      puVar1 = (uint *)cpuid(0x80000000);
      if (0x80000005 < *puVar1) {
        lVar2 = cpuid(0x80000005);
        *l1 = *(int *)(lVar2 + 0xc) >> 0xe & 0xfffffc00;
        lVar2 = cpuid(0x80000006);
        iVar3 = *(int *)(lVar2 + 8);
        *l2 = *(int *)(lVar2 + 0xc) >> 6 & 0xfffffc00;
        *l3 = iVar3 * 2 & 0x1ff80000;
        return;
      }
      *l3 = 0;
      *l2 = 0;
      *l1 = 0;
      return;
    }
    if (3 < iVar3) {
      *l3 = 0;
      *l2 = 0;
      *l1 = 0;
      uVar10 = 0;
      while( true ) {
        puVar1 = (uint *)cpuid_Deterministic_Cache_Parameters_info(4);
        uVar4 = *puVar1;
        uVar6 = puVar1[1];
        if (((uVar4 & 0xd) == 1) &&
           (((uVar11 = uVar4 >> 5 & 7, piVar9 = l1, uVar11 == 1 || (piVar9 = l3, uVar11 == 3)) ||
            (piVar9 = l2, uVar11 == 2)))) {
          *piVar9 = (puVar1[3] + 1) * ((uVar6 >> 0x16) + 1) *
                    ((uVar6 & 0xfff) + 1) * ((uVar6 >> 0xc & 0x3ff) + 1);
        }
        if ((uVar4 & 0xf) == 0) break;
        bVar12 = 0xe < uVar10;
        uVar10 = uVar10 + 1;
        if (bVar12) {
          return;
        }
      }
      return;
    }
  }
  if (iVar3 < 2) {
    *l3 = 0;
    *l2 = 0;
    *l1 = 0;
    return;
  }
  queryCacheSizes_intel_codes(l1,l2,l3);
  return;
}

Assistant:

inline void queryCacheSizes(int& l1, int& l2, int& l3)
{
  #ifdef EIGEN_CPUID
  int abcd[4];
  const int GenuineIntel[] = {0x756e6547, 0x49656e69, 0x6c65746e};
  const int AuthenticAMD[] = {0x68747541, 0x69746e65, 0x444d4163};
  const int AMDisbetter_[] = {0x69444d41, 0x74656273, 0x21726574}; // "AMDisbetter!"

  // identify the CPU vendor
  EIGEN_CPUID(abcd,0x0,0);
  int max_std_funcs = abcd[0];
  if(cpuid_is_vendor(abcd,GenuineIntel))
    queryCacheSizes_intel(l1,l2,l3,max_std_funcs);
  else if(cpuid_is_vendor(abcd,AuthenticAMD) || cpuid_is_vendor(abcd,AMDisbetter_))
    queryCacheSizes_amd(l1,l2,l3);
  else
    // by default let's use Intel's API
    queryCacheSizes_intel(l1,l2,l3,max_std_funcs);

  // here is the list of other vendors:
//   ||cpuid_is_vendor(abcd,"VIA VIA VIA ")
//   ||cpuid_is_vendor(abcd,"CyrixInstead")
//   ||cpuid_is_vendor(abcd,"CentaurHauls")
//   ||cpuid_is_vendor(abcd,"GenuineTMx86")
//   ||cpuid_is_vendor(abcd,"TransmetaCPU")
//   ||cpuid_is_vendor(abcd,"RiseRiseRise")
//   ||cpuid_is_vendor(abcd,"Geode by NSC")
//   ||cpuid_is_vendor(abcd,"SiS SiS SiS ")
//   ||cpuid_is_vendor(abcd,"UMC UMC UMC ")
//   ||cpuid_is_vendor(abcd,"NexGenDriven")
  #else
  l1 = l2 = l3 = -1;
  #endif
}